

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::ClassInitialize(void)

{
  bool bVar1;
  __type _Var2;
  char *__s;
  allocator<char> local_8f9;
  string pwd_str;
  string pwd_path;
  string pwd_changed;
  string cwd_changed;
  string local_878;
  string cwd_str;
  char buf [2048];
  
  Statics = operator_new(0x30);
  *(undefined4 *)((long)Statics + 8) = 0;
  *(undefined8 *)((long)Statics + 0x10) = 0;
  *(long *)((long)Statics + 0x18) = (long)Statics + 8;
  *(long *)((long)Statics + 0x20) = (long)Statics + 8;
  *(undefined8 *)((long)Statics + 0x28) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buf,"/tmp/",(allocator<char> *)&pwd_str);
  AddKeepPath((string *)buf);
  std::__cxx11::string::~string((string *)buf);
  pwd_str._M_dataplus._M_p = (pointer)&pwd_str.field_2;
  pwd_str._M_string_length = 0;
  pwd_str.field_2._M_local_buf[0] = '\0';
  bVar1 = GetEnv("PWD",&pwd_str);
  if (bVar1) {
    __s = getcwd(buf,0x800);
    if (__s != (char *)0x0) {
      cwd_changed._M_dataplus._M_p = (pointer)&cwd_changed.field_2;
      cwd_changed._M_string_length = 0;
      cwd_changed.field_2._M_local_buf[0] = '\0';
      pwd_changed._M_dataplus._M_p = (pointer)&pwd_changed.field_2;
      pwd_changed._M_string_length = 0;
      pwd_changed.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cwd_str,__s,(allocator<char> *)&pwd_path);
      pwd_path._M_dataplus._M_p = (pointer)&pwd_path.field_2;
      pwd_path._M_string_length = 0;
      pwd_path.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_878,pwd_str._M_dataplus._M_p,&local_8f9);
      Realpath(&local_878,&pwd_path,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_878);
      while( true ) {
        _Var2 = std::operator==(&cwd_str,&pwd_path);
        if (!_Var2) break;
        bVar1 = std::operator!=(&cwd_str,&pwd_str);
        if (!bVar1) break;
        std::__cxx11::string::_M_assign((string *)&cwd_changed);
        std::__cxx11::string::_M_assign((string *)&pwd_changed);
        GetFilenamePath(&local_878,&pwd_str);
        std::__cxx11::string::operator=((string *)&pwd_str,(string *)&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        GetFilenamePath(&local_878,&cwd_str);
        std::__cxx11::string::operator=((string *)&cwd_str,(string *)&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_878,pwd_str._M_dataplus._M_p,&local_8f9);
        Realpath(&local_878,&pwd_path,(string *)0x0);
        std::__cxx11::string::~string((string *)&local_878);
      }
      if ((cwd_changed._M_string_length != 0) && (pwd_changed._M_string_length != 0)) {
        AddTranslationPath(&cwd_changed,&pwd_changed);
      }
      std::__cxx11::string::~string((string *)&pwd_path);
      std::__cxx11::string::~string((string *)&cwd_str);
      std::__cxx11::string::~string((string *)&pwd_changed);
      std::__cxx11::string::~string((string *)&cwd_changed);
    }
  }
  std::__cxx11::string::~string((string *)&pwd_str);
  return;
}

Assistant:

void SystemTools::ClassInitialize()
{
#ifdef __VMS
  SetVMSFeature("DECC$FILENAME_UNIX_ONLY", 1);
#endif

  // Create statics singleton instance
  SystemTools::Statics = new SystemToolsStatic;

#if KWSYS_SYSTEMTOOLS_USE_TRANSLATION_MAP
// Add some special translation paths for unix.  These are not added
// for windows because drive letters need to be maintained.  Also,
// there are not sym-links and mount points on windows anyway.
#  if !defined(_WIN32) || defined(__CYGWIN__)
  // The tmp path is frequently a logical path so always keep it:
  SystemTools::AddKeepPath("/tmp/");

  // If the current working directory is a logical path then keep the
  // logical name.
  std::string pwd_str;
  if (SystemTools::GetEnv("PWD", pwd_str)) {
    char buf[2048];
    if (const char* cwd = Getcwd(buf, 2048)) {
      // The current working directory may be a logical path.  Find
      // the shortest logical path that still produces the correct
      // physical path.
      std::string cwd_changed;
      std::string pwd_changed;

      // Test progressively shorter logical-to-physical mappings.
      std::string cwd_str = cwd;
      std::string pwd_path;
      Realpath(pwd_str.c_str(), pwd_path);
      while (cwd_str == pwd_path && cwd_str != pwd_str) {
        // The current pair of paths is a working logical mapping.
        cwd_changed = cwd_str;
        pwd_changed = pwd_str;

        // Strip off one directory level and see if the logical
        // mapping still works.
        pwd_str = SystemTools::GetFilenamePath(pwd_str);
        cwd_str = SystemTools::GetFilenamePath(cwd_str);
        Realpath(pwd_str.c_str(), pwd_path);
      }

      // Add the translation to keep the logical path name.
      if (!cwd_changed.empty() && !pwd_changed.empty()) {
        SystemTools::AddTranslationPath(cwd_changed, pwd_changed);
      }
    }
  }
#  endif
#endif
}